

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O2

long __thiscall CVmFileStream::get_len(CVmFileStream *this)

{
  long seekpos;
  long lVar1;
  
  seekpos = CVmFile::get_pos(this->fp_);
  CVmFile::set_pos_from_eof(this->fp_,0);
  lVar1 = CVmFile::get_pos(this->fp_);
  CVmFile::set_pos(this->fp_,seekpos);
  return lVar1;
}

Assistant:

long get_len()
    {
        /* remember the current seek position */
        long orig = fp_->get_pos();
        
        /* seek to the end of the file */
        fp_->set_pos_from_eof(0);

        /* the seek position is the file length */
        long len = fp_->get_pos();

        /* seek back to where we started */
        fp_->set_pos(orig);

        /* return the stream length */
        return len;
    }